

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<QRect>::resize(QList<QRect> *this,qsizetype size)

{
  resize_internal(this,size);
  if ((this->d).size < size) {
    QArrayDataPointer<QRect>::appendInitialize(&this->d,size);
    return;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }